

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuaternion.h
# Opt level: O3

void __thiscall cbtMatrix3x3::setRotation(cbtMatrix3x3 *this,cbtQuaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  
  fVar1 = (q->super_cbtQuadWord).m_floats[1];
  fVar2 = (q->super_cbtQuadWord).m_floats[0];
  fVar3 = (q->super_cbtQuadWord).m_floats[2];
  fVar4 = (q->super_cbtQuadWord).m_floats[3];
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar2))
  ;
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar9 = 2.0 / auVar8._0_4_;
  fVar5 = fVar1 * fVar9;
  fVar6 = fVar3 * fVar9;
  fVar7 = fVar4 * fVar2 * fVar9;
  fVar9 = fVar2 * fVar2 * fVar9;
  this->m_el[0].m_floats[0] = 1.0 - (fVar1 * fVar5 + fVar3 * fVar6);
  this->m_el[0].m_floats[1] = fVar2 * fVar5 - fVar4 * fVar6;
  this->m_el[0].m_floats[2] = fVar4 * fVar5 + fVar2 * fVar6;
  this->m_el[0].m_floats[3] = 0.0;
  this->m_el[1].m_floats[0] = fVar2 * fVar5 + fVar4 * fVar6;
  this->m_el[1].m_floats[1] = 1.0 - (fVar9 + fVar3 * fVar6);
  this->m_el[1].m_floats[2] = fVar1 * fVar6 - fVar7;
  this->m_el[1].m_floats[3] = 0.0;
  this->m_el[2].m_floats[0] = fVar2 * fVar6 - fVar4 * fVar5;
  this->m_el[2].m_floats[1] = fVar1 * fVar6 + fVar7;
  this->m_el[2].m_floats[2] = 1.0 - (fVar9 + fVar1 * fVar5);
  this->m_el[2].m_floats[3] = 0.0;
  return;
}

Assistant:

cbtScalar dot(const cbtQuaternion& q) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd;

		vd = _mm_mul_ps(mVec128, q.mVec128);

		__m128 t = _mm_movehl_ps(vd, vd);
		vd = _mm_add_ps(vd, t);
		t = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, t);

		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, q.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_high_f32(vd));
		x = vpadd_f32(x, x);
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * q.x() +
			   m_floats[1] * q.y() +
			   m_floats[2] * q.z() +
			   m_floats[3] * q.m_floats[3];
#endif
	}